

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  ReporterConfig *in_RSI;
  XmlWriter *in_RDI;
  ReporterConfig *in_stack_00000018;
  CumulativeReporterBase *in_stack_00000020;
  ostream *in_stack_ffffffffffffffc8;
  
  CumulativeReporterBase::CumulativeReporterBase(in_stack_00000020,in_stack_00000018);
  *(undefined ***)in_RDI = &PTR__JunitReporter_001f11b0;
  ReporterConfig::stream(in_RSI);
  XmlWriter::XmlWriter(in_RDI,in_stack_ffffffffffffffc8);
  Timer::Timer((Timer *)&in_RDI[3].field_0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in_RDI[3].field_0x38);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 9));
  return;
}

Assistant:

JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {}